

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parsePostfixExpression_AtFollowOfPrimary<psy::C::CallExpressionSyntax>
          (Parser *this,ExpressionSyntax **expr,SyntaxKind exprK,
          function<bool_(psy::C::CallExpressionSyntax_*&)> *parsePostfix)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ostream *poVar4;
  CallExpressionSyntax *local_38;
  CallExpressionSyntax *postfixExpr;
  function<bool_(psy::C::CallExpressionSyntax_*&)> *parsePostfix_local;
  ExpressionSyntax **ppEStack_20;
  SyntaxKind exprK_local;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  postfixExpr = (CallExpressionSyntax *)parsePostfix;
  parsePostfix_local._6_2_ = exprK;
  ppEStack_20 = expr;
  expr_local = (ExpressionSyntax **)this;
  pSVar3 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar3);
  if (SVar2 != OpenBracketToken) {
    pSVar3 = peek(this,1);
    SVar2 = SyntaxToken::kind(pSVar3);
    if (SVar2 != OpenParenToken) {
      pSVar3 = peek(this,1);
      SVar2 = SyntaxToken::kind(pSVar3);
      if (SVar2 != DotToken) {
        pSVar3 = peek(this,1);
        SVar2 = SyntaxToken::kind(pSVar3);
        if (SVar2 != ArrowToken) {
          pSVar3 = peek(this,1);
          SVar2 = SyntaxToken::kind(pSVar3);
          if (SVar2 != PlusPlusToken) {
            pSVar3 = peek(this,1);
            SVar2 = SyntaxToken::kind(pSVar3);
            if (SVar2 != MinusMinusToken) {
              poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2af);
              poVar4 = std::operator<<(poVar4," ");
              poVar4 = std::operator<<(poVar4,
                                       "assert failure: `[\', `(\', `.\', `->\', \'++\', or `--\'");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              return false;
            }
          }
        }
      }
    }
  }
  local_38 = makeNode<psy::C::CallExpressionSyntax,psy::C::SyntaxKind&>
                       (this,(SyntaxKind *)((long)&parsePostfix_local + 6));
  local_38->expr_ = *ppEStack_20;
  *ppEStack_20 = &local_38->super_ExpressionSyntax;
  bVar1 = std::function<bool_(psy::C::CallExpressionSyntax_*&)>::operator()(parsePostfix,&local_38);
  return bVar1;
}

Assistant:

bool Parser::parsePostfixExpression_AtFollowOfPrimary(
        ExpressionSyntax*& expr,
        SyntaxKind exprK,
        std::function<bool(ExprT*&)> parsePostfix)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken
                        || peek().kind() == SyntaxKind::OpenParenToken
                        || peek().kind() == SyntaxKind::DotToken
                        || peek().kind() == SyntaxKind::ArrowToken
                        || peek().kind() == SyntaxKind::PlusPlusToken
                        || peek().kind() == SyntaxKind::MinusMinusToken,
                  return false,
                  "assert failure: `[', `(', `.', `->', '++', or `--'");

    auto postfixExpr = makeNode<ExprT>(exprK);
    postfixExpr->expr_ = expr;
    expr = postfixExpr;
    return parsePostfix(postfixExpr);
}